

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

void __thiscall Assimp::FICDATAValueImpl::~FICDATAValueImpl(FICDATAValueImpl *this)

{
  pointer pcVar1;
  
  (this->super_FICDATAValue).super_FIStringValue.super_FIValue._vptr_FIValue =
       (_func_int **)&PTR___cxa_pure_virtual_0095e760;
  pcVar1 = (this->super_FICDATAValue).super_FIStringValue.value._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_FICDATAValue).super_FIStringValue.value.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual const std::string &toString() const /*override*/ { return value; }